

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.cc
# Opt level: O3

void RigidBodyDynamics::jcalc_X_lambda_S(Model *model,uint joint_id,VectorNd *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  JointType JVar4;
  uint uVar5;
  pointer pJVar6;
  pointer pSVar7;
  pointer pSVar8;
  SpatialVector *pSVar9;
  CustomJoint *pCVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  pointer pMVar14;
  RBDLError *this;
  long lVar15;
  double *pdVar16;
  SpatialTransform *pSVar17;
  pointer pSVar18;
  byte bVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar20;
  SpatialTransform XJ;
  string local_188;
  undefined1 local_168 [16];
  SpatialTransform local_158;
  SpatialTransform local_f8;
  Quaternion local_98;
  double local_78 [9];
  
  bVar19 = 0;
  pJVar6 = (model->mJoints).
           super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           .
           super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  JVar4 = pJVar6[joint_id].mJointType;
  if ((int)JVar4 < 5) {
    if (JVar4 == JointTypeRevoluteX) {
      uVar5 = pJVar6[joint_id].q_index;
      pdVar16 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      dVar11 = sin(pdVar16[uVar5]);
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] = cos(pdVar16[uVar5]);
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = -dVar11;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = 1.0;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] = 0.0;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] = 0.0;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3] = 0.0;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] = 0.0;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[7] = dVar11;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[8] =
           local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[4];
    }
    else {
      if (JVar4 != JointTypeRevoluteY) goto LAB_0017afd9;
      uVar5 = pJVar6[joint_id].q_index;
      pdVar16 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      dVar11 = sin(pdVar16[uVar5]);
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = cos(pdVar16[uVar5]);
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] = -dVar11;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] = 0.0;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3] = 0.0;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] = 1.0;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = 0.0;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[7] = 0.0;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] = dVar11;
      local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[8] =
           local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
    }
LAB_0017b13c:
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = 0.0;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = 0.0;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = 0.0;
    Math::SpatialTransform::operator*
              (&local_f8,&local_158,
               (model->X_T).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + joint_id);
    pSVar7 = (model->X_lambda).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = &local_f8;
    pSVar18 = pSVar7 + joint_id;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      *(double *)&(pSVar18->E).super_Matrix3d =
           (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar17 = (SpatialTransform *)((long)pSVar17 + (ulong)bVar19 * -0x10 + 8);
      pSVar18 = (pointer)((long)pSVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    *(double *)
     &pSVar7[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar7[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
LAB_0017b18c:
    pSVar8 = (model->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    pSVar9 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start[joint_id].mJointAxes;
    dVar11 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 8);
    *(undefined8 *)
     &pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
         *(undefined8 *)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>;
    *(double *)
     ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = dVar11;
    dVar11 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 0x18);
    pdVar16 = (double *)
              ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
    *pdVar16 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 0x10);
    pdVar16[1] = dVar11;
    dVar11 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 0x28);
    pdVar16 = (double *)
              ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
    *pdVar16 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 0x20);
    pdVar16[1] = dVar11;
    return;
  }
  if (JVar4 == JointTypeRevoluteZ) {
    uVar5 = pJVar6[joint_id].q_index;
    pdVar16 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar11 = sin(pdVar16[uVar5]);
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = cos(pdVar16[uVar5]);
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = -dVar11;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] = 1.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = dVar11;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] =
         local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
    goto LAB_0017b13c;
  }
  if (JVar4 == JointTypeHelical) {
    jcalc_XJ(&local_f8,model,joint_id,q);
    Math::SpatialTransform::operator*
              (&local_158,&local_f8,
               (model->X_T).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + joint_id);
    pSVar7 = (model->X_lambda).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = &local_158;
    pSVar18 = pSVar7 + joint_id;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      *(double *)&(pSVar18->E).super_Matrix3d =
           (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar17 = (SpatialTransform *)((long)pSVar17 + (ulong)bVar19 * -0x10 + 8);
      pSVar18 = (pointer)((long)pSVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
         local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    *(double *)
     &pSVar7[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar7[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
         local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
    pSVar9 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start[joint_id].mJointAxes;
    dVar11 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 0x18);
    pSVar8 = (model->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    dVar1 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 0x20);
    dVar2 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 0x28);
    dVar3 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 0x10);
    dVar12 = *(double *)((long)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1> + 8);
    *(undefined8 *)
     &pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
         *(undefined8 *)&pSVar9->super_Matrix<double,_6,_1,_0,_6,_1>;
    *(double *)
     ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = dVar12;
    *(double *)
     ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = dVar3;
    pdVar16 = (double *)
              ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    *pdVar16 = dVar2 * local_f8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[6] +
               dVar1 * local_f8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[3] +
               dVar11 * local_f8.E.super_Matrix3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[0];
    pdVar16[1] = dVar2 * local_f8.E.super_Matrix3d.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[7] +
                 dVar1 * local_f8.E.super_Matrix3d.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array[4] +
                 dVar11 * local_f8.E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[1];
    *(double *)
     ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
         dVar2 * local_f8.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [8] +
         dVar1 * local_f8.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [5] +
         dVar11 * local_f8.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[2];
    return;
  }
LAB_0017afd9:
  if (pJVar6[joint_id].mDoFCount == 1) {
    if (JVar4 == JointTypeCustom) goto switchD_0017b1ea_caseD_14;
    jcalc_XJ(&local_158,model,joint_id,q);
    Math::SpatialTransform::operator*
              (&local_f8,&local_158,
               (model->X_T).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + joint_id);
    pSVar7 = (model->X_lambda).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = &local_f8;
    pSVar18 = pSVar7 + joint_id;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      *(double *)&(pSVar18->E).super_Matrix3d =
           (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar17 = (SpatialTransform *)((long)pSVar17 + (ulong)bVar19 * -0x10 + 8);
      pSVar18 = (pointer)((long)pSVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    *(double *)
     &pSVar7[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar7[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
    goto LAB_0017b18c;
  }
  switch(JVar4) {
  case JointTypeSpherical:
    uVar5 = pJVar6[joint_id].q_index;
    pdVar16 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_98.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         pdVar16[uVar5];
    local_98.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         pdVar16[uVar5 + 1];
    local_98.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
         pdVar16[uVar5 + 2];
    local_98.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
         pdVar16[(model->multdof3_w_index).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[joint_id]];
    Math::Quaternion::toMatrix(&local_98);
    pdVar16 = local_78;
    pSVar17 = &local_158;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *pdVar16;
      pdVar16 = pdVar16 + (ulong)bVar19 * -2 + 1;
      pSVar17 = (SpatialTransform *)((long)pSVar17 + (ulong)bVar19 * -0x10 + 8);
    }
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = 0.0;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = 0.0;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = 0.0;
    Math::SpatialTransform::operator*
              (&local_f8,&local_158,
               (model->X_T).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + joint_id);
    pSVar7 = (model->X_lambda).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = &local_f8;
    pSVar18 = pSVar7 + joint_id;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      *(double *)&(pSVar18->E).super_Matrix3d =
           (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar17 = (SpatialTransform *)((long)pSVar17 + (ulong)bVar19 * -0x10 + 8);
      pSVar18 = (pointer)((long)pSVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    *(double *)
     &pSVar7[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar7[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
    pMVar14 = (model->multdof3_S).
              super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              .
              super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start + joint_id;
    memset((double *)
           ((long)&(pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
           + 8),0,0x88);
    *(undefined8 *)
     &(pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage =
         0x3ff0000000000000;
    *(double *)
     ((long)&(pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage +
     0x38) = 1.0;
    *(double *)
     ((long)&(pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage +
     0x70) = 1.0;
    break;
  case JointTypeEulerZYX:
    uVar5 = pJVar6[joint_id].q_index;
    pdVar16 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar11 = pdVar16[uVar5];
    dVar1 = pdVar16[uVar5 + 1];
    dVar2 = pdVar16[uVar5 + 2];
    dVar3 = sin(dVar11);
    dVar11 = cos(dVar11);
    dVar12 = sin(dVar1);
    dVar1 = cos(dVar1);
    dVar13 = sin(dVar2);
    dVar2 = cos(dVar2);
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = dVar11 * dVar1;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = dVar3 * dVar1;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = dVar11 * dVar12 * dVar13 + -dVar3 * dVar2;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = dVar11 * dVar12 * dVar2 + dVar13 * dVar3;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = dVar12 * dVar3 * dVar13 + dVar2 * dVar11;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = dVar12 * dVar3 * dVar2 + -dVar11 * dVar13;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = 0.0;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = 0.0;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] = -dVar12;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] = dVar1 * dVar13;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] = dVar1 * dVar2;
    Math::SpatialTransform::operator*
              (&local_f8,&local_158,
               (model->X_T).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + joint_id);
    pSVar7 = (model->X_lambda).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = &local_f8;
    pSVar18 = pSVar7 + joint_id;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      *(double *)&(pSVar18->E).super_Matrix3d =
           (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar17 = (SpatialTransform *)((long)pSVar17 + (ulong)bVar19 * -0x10 + 8);
      pSVar18 = (pointer)((long)pSVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    *(double *)
     &pSVar7[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar7[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
    pMVar14 = (model->multdof3_S).
              super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              .
              super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x58);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x38);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x88) = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x78);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x68);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x48);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x28);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x18);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    *(double *)
     &pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
         -dVar12;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x60) = 1.0;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 8) = dVar1 * dVar13;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x38) = dVar2;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x10) = dVar1 * dVar2;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x40) = -dVar13;
    break;
  case JointTypeEulerXYZ:
    uVar5 = pJVar6[joint_id].q_index;
    pdVar16 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar11 = pdVar16[uVar5];
    dVar1 = pdVar16[uVar5 + 1];
    dVar2 = pdVar16[uVar5 + 2];
    dVar3 = sin(dVar11);
    dVar11 = cos(dVar11);
    dVar12 = sin(dVar1);
    dVar1 = cos(dVar1);
    dVar13 = sin(dVar2);
    dVar2 = cos(dVar2);
    dVar20 = dVar1 * -dVar13;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = -dVar1 * dVar3;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] = dVar1 * dVar11;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = dVar13 * dVar11 + dVar2 * dVar12 * dVar3;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = dVar2 * dVar11 + -dVar13 * dVar12 * dVar3;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] = dVar13 * dVar3 + -dVar2 * dVar12 * dVar11;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] = dVar2 * dVar3 + dVar13 * dVar12 * dVar11;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = 0.0;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = 0.0;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = dVar1 * dVar2;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = dVar20;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = dVar12;
    Math::SpatialTransform::operator*
              (&local_f8,&local_158,
               (model->X_T).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + joint_id);
    pSVar7 = (model->X_lambda).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = &local_f8;
    pSVar18 = pSVar7 + joint_id;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      *(double *)&(pSVar18->E).super_Matrix3d =
           (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar17 = (SpatialTransform *)((long)pSVar17 + (ulong)bVar19 * -0x10 + 8);
      pSVar18 = (pointer)((long)pSVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    *(double *)
     &pSVar7[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar7[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
    pMVar14 = (model->multdof3_S).
              super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              .
              super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x28);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x38);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x68);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x88) = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x78);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x58);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x48);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x18);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    *(double *)
     &pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
         dVar1 * dVar2;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x30) = dVar13;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 8) = dVar20;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x38) = dVar2;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x10) = dVar12;
    goto LAB_0017bb3f;
  case JointTypeEulerYXZ:
    uVar5 = pJVar6[joint_id].q_index;
    pdVar16 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar11 = pdVar16[uVar5];
    dVar1 = pdVar16[uVar5 + 1];
    dVar2 = pdVar16[uVar5 + 2];
    dVar3 = sin(dVar11);
    dVar11 = cos(dVar11);
    dVar12 = sin(dVar1);
    dVar1 = cos(dVar1);
    dVar13 = sin(dVar2);
    local_168._8_4_ = extraout_XMM0_Dc;
    local_168._0_8_ = dVar13;
    local_168._12_4_ = extraout_XMM0_Dd;
    dVar2 = cos(dVar2);
    dVar13 = dVar1 * (double)local_168._0_8_;
    dVar20 = -(double)local_168._0_8_;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = dVar3 * dVar1;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] = dVar1 * dVar11;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = dVar2 * dVar11 + dVar3 * (double)local_168._0_8_ * dVar12;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = dVar20 * dVar11 + dVar3 * dVar2 * dVar12;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] = -dVar2 * dVar3 + dVar11 * (double)local_168._0_8_ * dVar12;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] = (double)local_168._0_8_ * dVar3 + dVar11 * dVar2 * dVar12;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = 0.0;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = 0.0;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = dVar13;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = dVar1 * dVar2;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = -dVar12;
    Math::SpatialTransform::operator*
              (&local_f8,&local_158,
               (model->X_T).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + joint_id);
    pSVar7 = (model->X_lambda).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = &local_f8;
    pSVar18 = pSVar7 + joint_id;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      *(double *)&(pSVar18->E).super_Matrix3d =
           (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar17 = (SpatialTransform *)((long)pSVar17 + (ulong)bVar19 * -0x10 + 8);
      pSVar18 = (pointer)((long)pSVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    *(double *)
     &pSVar7[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar7[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
    pMVar14 = (model->multdof3_S).
              super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              .
              super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x28);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x38);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x68);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x88) = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x78);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x58);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x48);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    pdVar16 = (double *)
              ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                      .m_storage + 0x18);
    *pdVar16 = 0.0;
    pdVar16[1] = 0.0;
    *(double *)
     &pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
         dVar13;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x30) = dVar2;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 8) = dVar1 * dVar2;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x38) = dVar20;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x10) = -dVar12;
LAB_0017bb3f:
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x70) = 1.0;
    break;
  case JointTypeTranslationXYZ:
    uVar5 = pJVar6[joint_id].q_index;
    pdVar16 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = pdVar16[uVar5];
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = pdVar16[uVar5 + 1];
    local_158.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = pdVar16[uVar5 + 2];
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] = 0.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = 1.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = 1.0;
    local_158.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] = 1.0;
    Math::SpatialTransform::operator*
              (&local_f8,&local_158,
               (model->X_T).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + joint_id);
    pSVar7 = (model->X_lambda).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = &local_f8;
    pSVar18 = pSVar7 + joint_id;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      *(double *)&(pSVar18->E).super_Matrix3d =
           (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar17 = (SpatialTransform *)((long)pSVar17 + (ulong)bVar19 * -0x10 + 8);
      pSVar18 = (pointer)((long)pSVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar7[joint_id].r.super_Vector3d + 0x10) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    *(double *)
     &pSVar7[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar7[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
         local_f8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
    pMVar14 = (model->multdof3_S).
              super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              .
              super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    memset(pMVar14 + joint_id,0,0x88);
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x18) = 1.0;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x50) = 1.0;
    *(double *)
     ((long)&pMVar14[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
             m_storage + 0x88) = 1.0;
    break;
  default:
    this = (RBDLError *)__cxa_allocate_exception(0x28);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"Error: invalid joint type!","");
    Errors::RBDLError::RBDLError(this,&local_188);
    __cxa_throw(this,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  case JointTypeCustom:
switchD_0017b1ea_caseD_14:
    pCVar10 = (model->mCustomJoints).
              super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ._M_impl.super__Vector_impl_data._M_start[pJVar6[joint_id].custom_joint_index];
    (**(code **)(*(long *)pCVar10 + 0x18))(pCVar10,model);
    return;
  }
  return;
}

Assistant:

RBDL_DLLAPI void jcalc_X_lambda_S (
    Model &model,
    unsigned int joint_id,
    const VectorNd &q
    ) {
  // exception if we calculate it for the root body
  assert (joint_id > 0);

  if (model.mJoints[joint_id].mJointType == JointTypeRevoluteX) {
    model.X_lambda[joint_id] = 
      Xrotx (q[model.mJoints[joint_id].q_index]) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteY) {
    model.X_lambda[joint_id] = 
      Xroty (q[model.mJoints[joint_id].q_index]) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteZ) {
    model.X_lambda[joint_id] = 
      Xrotz (q[model.mJoints[joint_id].q_index]) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeHelical){
    SpatialTransform XJ = jcalc_XJ (model, joint_id, q);
    model.X_lambda[joint_id] = XJ * model.X_T[joint_id];
    // Set the joint axis
    Vector3d trans = XJ.E * model.mJoints[joint_id].mJointAxes[0].block<3, 1>(3,0);
    
    model.S[joint_id] = SpatialVector(model.mJoints[joint_id].mJointAxes[0][0],
           model.mJoints[joint_id].mJointAxes[0][1],
           model.mJoints[joint_id].mJointAxes[0][2],
           trans[0], trans[1], trans[2]);
  } else if (model.mJoints[joint_id].mDoFCount == 1
      && model.mJoints[joint_id].mJointType != JointTypeCustom){
    model.X_lambda[joint_id] = 
      jcalc_XJ (model, joint_id, q) * model.X_T[joint_id];
    model.S[joint_id] = model.mJoints[joint_id].mJointAxes[0];
  } else if (model.mJoints[joint_id].mJointType == JointTypeSpherical) {
    model.X_lambda[joint_id] = SpatialTransform (
        model.GetQuaternion (joint_id, q).toMatrix(),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = 1.;
    model.multdof3_S[joint_id](1,1) = 1.;
    model.multdof3_S[joint_id](2,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerZYX) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_lambda[joint_id] = SpatialTransform ( 
        Matrix3d(
          c0 * c1, s0 * c1, -s1,
          c0 * s1 * s2 - s0 * c2, s0 * s1 * s2 + c0 * c2, c1 * s2,
          c0 * s1 * c2 + s0 * s2, s0 * s1 * c2 - c0 * s2, c1 * c2
          ),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = -s1;
    model.multdof3_S[joint_id](0,2) = 1.;

    model.multdof3_S[joint_id](1,0) = c1 * s2;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = c1 * c2;
    model.multdof3_S[joint_id](2,1) = - s2;
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerXYZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_lambda[joint_id] = SpatialTransform (
        Matrix3d(
          c2 * c1, s2 * c0 + c2 * s1 * s0, s2 * s0 - c2 * s1 * c0,
          -s2 * c1, c2 * c0 - s2 * s1 * s0, c2 * s0 + s2 * s1 * c0,
          s1, -c1 * s0, c1 * c0
          ),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = c2 * c1;
    model.multdof3_S[joint_id](0,1) = s2;

    model.multdof3_S[joint_id](1,0) = -s2 * c1;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = s1;
    model.multdof3_S[joint_id](2,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerYXZ ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_lambda[joint_id] = SpatialTransform (
        Matrix3d(
          c2 * c0 + s2 * s1 * s0, s2 * c1, -c2 * s0 + s2 * s1 * c0,
          -s2 * c0 + c2 * s1 * s0, c2 * c1, s2 * s0 + c2 * s1 * c0,
          c1 * s0, - s1, c1 * c0
          ),
        Vector3d (0., 0., 0.))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](0,0) = s2 * c1;
    model.multdof3_S[joint_id](0,1) = c2;

    model.multdof3_S[joint_id](1,0) = c2 * c1;
    model.multdof3_S[joint_id](1,1) = -s2;

    model.multdof3_S[joint_id](2,0) = -s1;
    model.multdof3_S[joint_id](2,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeTranslationXYZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    model.X_lambda[joint_id] = SpatialTransform (
        Matrix3d::Identity (),
        Vector3d (q0, q1, q2))
      * model.X_T[joint_id];

    model.multdof3_S[joint_id].setZero();

    model.multdof3_S[joint_id](3,0) = 1.;
    model.multdof3_S[joint_id](4,1) = 1.;
    model.multdof3_S[joint_id](5,2) = 1.;
  } else if (model.mJoints[joint_id].mJointType == JointTypeCustom) {
    const Joint &joint = model.mJoints[joint_id];
    CustomJoint *custom_joint 
      = model.mCustomJoints[joint.custom_joint_index];

    custom_joint->jcalc_X_lambda_S (model, joint_id, q);
  } else {
    throw Errors::RBDLError("Error: invalid joint type!");
  }
}